

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Real Omega_h::get_expected_nelems(Mesh *mesh,Reals *v2m)

{
  Int IVar1;
  Real RVar2;
  double dVar3;
  Write<double> local_20;
  
  Write<double>::Write(&local_20,&v2m->write_);
  RVar2 = get_complexity(mesh,(Reals *)&local_20);
  Write<double>::~Write(&local_20);
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    dVar3 = 0.0838934100219;
  }
  else {
    dVar3 = *(double *)(&DAT_003808b0 + (ulong)(IVar1 == 2) * 8);
  }
  return RVar2 / dVar3;
}

Assistant:

Real get_expected_nelems(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity(mesh, v2m);
  return get_expected_nelems_from_complexity(complexity, mesh->dim());
}